

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void partial_suite::parse_array(void)

{
  bool v;
  reader *reader_00;
  basic_variable<std::allocator<char>_> *local_380;
  iterator local_368;
  iterator local_350;
  iterator local_338;
  iterator local_320;
  nullable local_304;
  basic_variable<std::allocator<char>_> *local_300;
  basic_variable<std::allocator<char>_> local_2f8;
  basic_variable<std::allocator<char>_> local_2c8;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  undefined1 local_208 [24];
  variable expect;
  basic_variable<std::allocator<char>_> result;
  undefined1 local_188 [8];
  reader reader;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"[null,true,2,3.0,\"alpha\"]",&local_29);
  std::allocator<char>::~allocator(&local_29);
  result.storage._40_8_ = std::__cxx11::string::operator_cast_to_basic_string_view(local_28);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_188,(view_type *)&result.storage.field_0x28);
  trial::protocol::json::partial::parse<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,
             (partial *)local_188,reader_00);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)&expect.storage.field_0x28);
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1c5,"void partial_suite::parse_array()",v);
  local_300 = &local_2f8;
  local_304 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_300,&local_304);
  local_300 = &local_2c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_300,true);
  local_300 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_300,2);
  local_300 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_300,3.0);
  local_300 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_300,"alpha");
  local_208._0_8_ = &local_2f8;
  local_208._8_8_ = 5;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_208);
  local_380 = (basic_variable<std::allocator<char>_> *)local_208;
  do {
    local_380 = local_380 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_380);
  } while (local_380 != &local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_320,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_338,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_368,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x1ca,"void partial_suite::parse_array()",&local_320,&local_338,&local_350,&local_368)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_320);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_188);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void parse_array()
{
    std::string input = "[null,true,2,3.0,\"alpha\"]";
    json::reader reader(input);
    auto result = json::partial::parse(reader);
    TRIAL_PROTOCOL_TEST(result.is<array>());

    variable expect = { null, true, 2, 3.0, "alpha" };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}